

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

ON_wString __thiscall
ON_wString::FromYearMonthDayHourMinuteSecond
          (ON_wString *this,int year,int month,int mday,int hour,int minute,int second,
          ON_DateFormat date_format,ON_TimeFormat time_format,wchar_t date_separator,
          wchar_t date_time_separator,wchar_t time_separator)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ON_wString *this_00;
  ulong uVar4;
  uint date;
  ulong uVar5;
  wchar_t *pwVar6;
  wchar_t ts [2];
  wchar_t ds [2];
  ON_wString *result;
  ON_wString local_70;
  ON_wString local_68;
  ON_wString local_60;
  uint local_54;
  uint local_50;
  wchar_t local_4c [3];
  undefined4 local_40;
  wchar_t local_3c;
  ON_wString *local_38;
  
  uVar4 = (ulong)(uint)year;
  if (year < 0x62e) {
    uVar4 = 0;
  }
  uVar5 = (ulong)(uint)mday;
  if (mday - 0x20U < 0xffffffe1) {
    uVar5 = 0;
  }
  if (month - 0xdU < 0xfffffff4) {
    month = 0;
  }
  date = (uint)uVar5;
  uVar3 = (uint)uVar4;
  local_54 = hour;
  local_50 = minute;
  local_38 = this;
  if (date_format == YearDayOfYear) {
    uVar3 = ON_DayOfGregorianYear(uVar3,month,date);
    local_4c[2] = L'-';
    if (date_separator != L'\0') {
      local_4c[2] = date_separator;
    }
    local_3c = L' ';
    if (date_time_separator != L'\0') {
      local_3c = date_time_separator;
    }
    local_4c[0] = L':';
    if (time_separator != L'\0') {
      local_4c[0] = time_separator;
    }
    local_40 = 0;
    local_4c[1] = 0;
    pwVar6 = L"AM";
    if (0xb < hour) {
      pwVar6 = L"PM";
    }
    ON_wString(&local_60);
    FormatToString((wchar_t *)&local_70,L"%d%ls%d",uVar4,local_4c + 2,(ulong)uVar3);
    operator=(&local_60,&local_70);
    ~ON_wString(&local_70);
    if (0 < (int)uVar3) {
switchD_005bcf20_caseD_0:
      ON_wString(&local_70);
      if (time_format - HourMinute12 < 4) {
        iVar1 = (int)local_54 >> 0x1f;
        switch(time_format) {
        case HourMinute12:
          FormatToString((wchar_t *)&local_68,L"%02d%ls%02d%ls",
                         (ulong)(local_54 +
                                (((uint)((int)local_54 / 6 + iVar1) >> 1) - iVar1) * -0xc),local_4c,
                         (ulong)local_50,pwVar6);
          operator=(&local_70,&local_68);
          break;
        case HourMinuteSecond12:
          FormatToString((wchar_t *)&local_68,L"%02d%ls%02d%ls%02d%ls",
                         (ulong)(local_54 +
                                (((uint)((int)local_54 / 6 + iVar1) >> 1) - iVar1) * -0xc),local_4c,
                         (ulong)local_50,local_4c,second,pwVar6);
          operator=(&local_70,&local_68);
          break;
        case HourMinute24:
          FormatToString((wchar_t *)&local_68,L"%02d%ls%02d",(ulong)local_54,local_4c,
                         (ulong)local_50);
          operator=(&local_70,&local_68);
          break;
        case HourMinuteSecond24:
          FormatToString((wchar_t *)&local_68,L"%02d%ls%02d%ls%02d",(ulong)local_54,local_4c,
                         (ulong)local_50,local_4c,second);
          operator=(&local_70,&local_68);
        }
        ~ON_wString(&local_68);
      }
      this_00 = local_38;
      ON_wString(local_38,&local_60);
      bVar2 = IsNotEmpty(this_00);
      if ((bVar2) && (bVar2 = IsNotEmpty(&local_70), bVar2)) {
        local_68.m_s._0_4_ = local_3c;
        local_68.m_s._4_4_ = 0;
        operator+=(this_00,(wchar_t *)&local_68);
      }
      operator+=(this_00,&local_70);
      ~ON_wString(&local_70);
      goto LAB_005bd1e2;
    }
  }
  else {
    local_4c[2] = L'-';
    if (date_separator != L'\0') {
      local_4c[2] = date_separator;
    }
    local_3c = L' ';
    if (date_time_separator != L'\0') {
      local_3c = date_time_separator;
    }
    local_4c[0] = L':';
    if (time_separator != L'\0') {
      local_4c[0] = time_separator;
    }
    local_40 = 0;
    local_4c[1] = 0;
    pwVar6 = L"AM";
    if (0xb < hour) {
      pwVar6 = L"PM";
    }
    ON_wString(&local_60);
    switch(date_format) {
    case Unset:
    case Omit:
      goto switchD_005bcf20_caseD_0;
    case YearMonthDay:
      FormatToString((wchar_t *)&local_70,L"%d%ls%d%ls%d",uVar4,local_4c + 2,(ulong)(uint)month,
                     local_4c + 2,date);
      operator=(&local_60,&local_70);
      break;
    case YearDayMonth:
      FormatToString((wchar_t *)&local_70,L"%d%ls%d%ls%d",uVar4,local_4c + 2,uVar5,local_4c + 2,
                     month);
      operator=(&local_60,&local_70);
      break;
    case MonthDayYear:
      FormatToString((wchar_t *)&local_70,L"%d%ls%d%ls%d",(ulong)(uint)month,local_4c + 2,uVar5,
                     local_4c + 2,uVar3);
      operator=(&local_60,&local_70);
      break;
    case DayMonthYear:
      FormatToString((wchar_t *)&local_70,L"%d%ls%d%ls%d",uVar5,local_4c + 2,(ulong)(uint)month,
                     local_4c + 2,uVar3);
      operator=(&local_60,&local_70);
      break;
    default:
      goto switchD_005bcf20_default;
    }
    ~ON_wString(&local_70);
switchD_005bcf20_default:
    if (date != 0 && month != 0) goto switchD_005bcf20_caseD_0;
  }
  this_00 = local_38;
  ON_wString(local_38,&EmptyString);
LAB_005bd1e2:
  ~ON_wString(&local_60);
  return (ON_wString)(wchar_t *)this_00;
}

Assistant:

const ON_wString ON_wString::FromYearMonthDayHourMinuteSecond(
  int year,
  int month,
  int mday,
  int hour,
  int minute,
  int second,
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  if (year < 1582)
    year = 0;

  if (mday < 1 || mday > 31)
    mday = 0;

  if (month < 1 || month > 12)
    month = 0;

  const int yday
    = (ON_DateFormat::YearDayOfYear == date_format)
    ? ON_DayOfGregorianYear(year, month, mday)
    : 0;

  if (0 == date_separator)
    date_separator = ON_wString::HyphenMinus;
  if (0 == date_time_separator)
    date_time_separator = ON_wString::Space;
  if (0 == time_separator)
    time_separator = ':';
  
  bool bValidDate 
    = ON_DateFormat::YearDayOfYear == date_format
    ? (yday > 0)
    : (month > 0 && mday > 0);
  bool bValidHMS = (hour >= 0 && minute >= 0 && second >= 0 && hour < 24 && minute <= 59 && second <= 59);


  const wchar_t ds[2] = { date_separator, 0 };
  const wchar_t ts[2] = { time_separator, 0 };
  const wchar_t* ampm = (hour >= 12) ? L"PM" : L"AM";
  
  ON_wString date;
  switch (date_format)
  {
  case ON_DateFormat::Unset:
    bValidDate = true;
    break;
  case ON_DateFormat::Omit:
    bValidDate = true;
    break;
  case ON_DateFormat::YearMonthDay:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", year, ds, month, ds, mday);
    break;
  case ON_DateFormat::YearDayMonth:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", year, ds, mday, ds, month);
    break;
  case ON_DateFormat::MonthDayYear:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", month, ds, mday, ds, year);
    break;
  case ON_DateFormat::DayMonthYear:
    date = ON_wString::FormatToString(L"%d%ls%d%ls%d", mday, ds, month, ds, year);
    break;
  case ON_DateFormat::YearDayOfYear:
    date = ON_wString::FormatToString(L"%d%ls%d", year, ds, yday);
    break;
  default:
    break;
  }
  if (false == bValidDate)
    return ON_wString::EmptyString;
  
  ON_wString hms;
  switch (time_format)
  {
  case ON_TimeFormat::Unset:
    bValidHMS = true;
    break;
  case ON_TimeFormat::Omit:
    bValidHMS = true;
    break;
  case ON_TimeFormat::HourMinute12:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls", hour%12, ts, minute, ampm);
    break;
  case ON_TimeFormat::HourMinuteSecond12:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls%02d%ls", hour%12, ts, minute, ts, second, ampm);
    break;
  case ON_TimeFormat::HourMinute24:
    hms = ON_wString::FormatToString(L"%02d%ls%02d", hour, ts, minute);
    break;
  case ON_TimeFormat::HourMinuteSecond24:
    hms = ON_wString::FormatToString(L"%02d%ls%02d%ls%02d", hour, ts, minute, ts, second);
    break;
  default:
    break;
  }

  ON_wString result = date;
  if (result.IsNotEmpty() && hms.IsNotEmpty())
  {
    const wchar_t dts[] = { date_time_separator,0 };
    result += dts;
  }
  result += hms;

  return result;
}